

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86::forward
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  _func_int *p_Var12;
  ulong uVar13;
  uint uVar14;
  Mat *pMVar15;
  Mat *pMVar16;
  int *piVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint _w;
  int iVar24;
  int iVar25;
  int iVar26;
  size_t sVar27;
  Mat *pMVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  bool bVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int TILE_K;
  ulong local_238;
  Mat *local_230;
  Mat *local_228;
  ulong local_220;
  ulong local_218;
  Mat *local_210;
  ulong local_208;
  int TILE_K_1;
  Mat local_1f8;
  ulong local_1a8;
  ulong local_1a0;
  Mat *local_198;
  ulong local_190;
  Mat local_188;
  Mat local_138;
  int TILE_M;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  int local_d0;
  Allocator *local_c8;
  int iStack_c0;
  uint uStack_bc;
  int iStack_b8;
  undefined8 uStack_b4;
  ulong local_a8;
  ulong local_a0;
  int TILE_K_2;
  ulong local_90;
  int TILE_N;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  uint uStack_5c;
  int iStack_58;
  undefined8 uStack_54;
  ulong local_48;
  ulong local_38;
  
  p_Var12 = this->_vptr_Gemm_x86[-3];
  iVar33 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar35 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
    if (iVar33 != 0) {
      if (iVar35 == 0) {
        uVar14 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar14 = pMVar1->w;
      }
      goto LAB_004a5074;
    }
    if (iVar35 == 0) {
      uVar14 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
    else {
      uVar14 = pMVar1->w;
    }
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar18 = pMVar1[1].w;
    }
    else {
      uVar18 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
    }
  }
  else if (iVar33 == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = *(uint *)(&this->field_0xec + (long)p_Var12);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar18 = pMVar1->w;
    }
    else {
      uVar18 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
  }
  else {
    uVar14 = *(uint *)(&this->field_0xec + (long)p_Var12);
LAB_004a5074:
    uVar18 = *(uint *)(&this->field_0xf0 + (long)p_Var12);
  }
  local_1f8.cstep = 0;
  iVar33 = 0;
  uVar34 = 0;
  iVar35 = 0;
  iVar36 = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize._0_4_ = 0;
  local_1f8.elemsize._4_4_ = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  p_Var12 = this->_vptr_Gemm_x86[-3];
  if (*(int *)(&this->field_0xe8 + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar29 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    iVar26 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
    if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
      if (iVar26 == 0) {
        bVar32 = true;
        if (lVar29 == 0xd8) {
          local_1f8.data = pMVar1[2].data;
          piVar17 = pMVar1[2].refcount;
          sVar27 = pMVar1[2].elemsize;
          local_1f8.elempack = pMVar1[2].elempack;
          local_1f8.allocator = pMVar1[2].allocator;
          iVar33 = pMVar1[2].dims;
          uVar34 = pMVar1[2].w;
          iVar35 = pMVar1[2].h;
          iVar36 = pMVar1[2].d;
          local_1f8.c = pMVar1[2].c;
          local_1f8.cstep = pMVar1[2].cstep;
          if (piVar17 == (int *)0x0) {
            piVar17 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar17 = *piVar17 + 1;
            UNLOCK();
            LOCK();
            *piVar17 = *piVar17 + 1;
            UNLOCK();
            bVar32 = false;
          }
        }
        else {
          local_1f8.cstep = 0;
          local_1f8.c = 0;
          local_1f8.allocator = (Allocator *)0x0;
          local_1f8.elempack = 0;
          sVar27 = 0;
          piVar17 = (int *)0x0;
          local_1f8.data = (void *)0x0;
        }
        local_1f8.refcount._0_4_ = SUB84(piVar17,0);
        local_1f8.refcount._4_4_ = (undefined4)((ulong)piVar17 >> 0x20);
        local_1f8.elemsize._0_4_ = (undefined4)sVar27;
        local_1f8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
        local_1f8.dims = iVar33;
        local_1f8.w = uVar34;
        local_1f8.h = iVar35;
        local_1f8.d = iVar36;
        if (!bVar32) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004a73b1;
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
      else {
        bVar32 = true;
        if (lVar29 == 0x90) {
          local_1f8.data = pMVar1[1].data;
          piVar17 = pMVar1[1].refcount;
          sVar27 = pMVar1[1].elemsize;
          local_1f8.elempack = pMVar1[1].elempack;
          local_1f8.allocator = pMVar1[1].allocator;
          iVar33 = pMVar1[1].dims;
          uVar34 = pMVar1[1].w;
          iVar35 = pMVar1[1].h;
          iVar36 = pMVar1[1].d;
          local_1f8.c = pMVar1[1].c;
          local_1f8.cstep = pMVar1[1].cstep;
          if (piVar17 == (int *)0x0) {
            piVar17 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar17 = *piVar17 + 1;
            UNLOCK();
            LOCK();
            *piVar17 = *piVar17 + 1;
            UNLOCK();
            bVar32 = false;
          }
        }
        else {
          local_1f8.cstep = 0;
          local_1f8.c = 0;
          local_1f8.allocator = (Allocator *)0x0;
          local_1f8.elempack = 0;
          sVar27 = 0;
          piVar17 = (int *)0x0;
          local_1f8.data = (void *)0x0;
        }
        local_1f8.refcount._0_4_ = SUB84(piVar17,0);
        local_1f8.refcount._4_4_ = (undefined4)((ulong)piVar17 >> 0x20);
        local_1f8.elemsize._0_4_ = (undefined4)sVar27;
        local_1f8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
        local_1f8.dims = iVar33;
        local_1f8.w = uVar34;
        local_1f8.h = iVar35;
        local_1f8.d = iVar36;
        if (!bVar32) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004a73b1;
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
    }
    else if (iVar26 == 0) {
      bVar32 = true;
      if (lVar29 == 0x90) {
        local_1f8.data = pMVar1[1].data;
        piVar17 = pMVar1[1].refcount;
        sVar27 = pMVar1[1].elemsize;
        local_1f8.elempack = pMVar1[1].elempack;
        local_1f8.allocator = pMVar1[1].allocator;
        iVar33 = pMVar1[1].dims;
        uVar34 = pMVar1[1].w;
        iVar35 = pMVar1[1].h;
        iVar36 = pMVar1[1].d;
        local_1f8.c = pMVar1[1].c;
        local_1f8.cstep = pMVar1[1].cstep;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
          bVar32 = false;
        }
      }
      else {
        local_1f8.cstep = 0;
        local_1f8.c = 0;
        local_1f8.allocator = (Allocator *)0x0;
        local_1f8.elempack = 0;
        sVar27 = 0;
        piVar17 = (int *)0x0;
        local_1f8.data = (void *)0x0;
      }
      local_1f8.refcount._0_4_ = SUB84(piVar17,0);
      local_1f8.refcount._4_4_ = (undefined4)((ulong)piVar17 >> 0x20);
      local_1f8.elemsize._0_4_ = (undefined4)sVar27;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1f8.dims = iVar33;
      local_1f8.w = uVar34;
      local_1f8.h = iVar35;
      local_1f8.d = iVar36;
      if (!bVar32) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004a73b1;
          (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
        }
      }
    }
    else {
      bVar32 = true;
      if (lVar29 == 0x48) {
        local_1f8.data = pMVar1->data;
        piVar17 = pMVar1->refcount;
        sVar27 = pMVar1->elemsize;
        local_1f8.elempack = pMVar1->elempack;
        local_1f8.allocator = pMVar1->allocator;
        iVar33 = pMVar1->dims;
        uVar34 = pMVar1->w;
        iVar35 = pMVar1->h;
        iVar36 = pMVar1->d;
        local_1f8.c = pMVar1->c;
        local_1f8.cstep = pMVar1->cstep;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
          bVar32 = false;
        }
      }
      else {
        local_1f8.allocator = (Allocator *)0x0;
        local_1f8.elempack = 0;
        sVar27 = 0;
        piVar17 = (int *)0x0;
        local_1f8.data = (void *)0x0;
        local_1f8.c = 0;
        local_1f8.cstep = 0;
      }
      local_1f8.refcount._0_4_ = SUB84(piVar17,0);
      local_1f8.refcount._4_4_ = (undefined4)((ulong)piVar17 >> 0x20);
      local_1f8.elemsize._0_4_ = (undefined4)sVar27;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1f8.dims = iVar33;
      local_1f8.w = uVar34;
      local_1f8.h = iVar35;
      local_1f8.d = iVar36;
      if (!bVar32) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
LAB_004a73b1:
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
    }
    uVar34 = 0;
    if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
      if (local_1f8.dims == 1) {
        uVar34 = 4;
        if (local_1f8.w * local_1f8.elempack != uVar18) {
          uVar34 = (uint)(local_1f8.w * local_1f8.elempack == uVar14);
        }
      }
      else {
        bVar32 = local_1f8.dims == 2;
        uVar34 = 0;
        if (local_1f8.w == 1U && bVar32) {
          uVar34 = (uint)(local_1f8.elempack * local_1f8.h == uVar14) * 2;
        }
        if ((local_1f8.w == 1U && bVar32 || bVar32) && (local_1f8.w == uVar18)) {
          if (local_1f8.elempack * local_1f8.h == uVar14) {
            uVar34 = 3;
          }
          if (local_1f8.elempack * local_1f8.h == 1) {
            uVar34 = 4;
          }
        }
      }
      if (*(float *)((long)&(this->CT_data).d + (long)this->_vptr_Gemm_x86[-3]) != 1.0) {
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
        Mat::create_like(&local_188,&local_1f8,opt->workspace_allocator);
        uVar22 = local_1f8.c * (int)local_1f8.cstep * local_1f8.elempack;
        if (0 < (int)uVar22) {
          pp_Var3 = this->_vptr_Gemm_x86;
          uVar20 = 0;
          do {
            *(float *)((long)local_188.data + uVar20 * 4) =
                 *(float *)((long)&(this->CT_data).d + (long)pp_Var3[-3]) *
                 *(float *)((long)local_1f8.data + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
        }
        piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
        }
        piVar17 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) {
              if (local_1f8.data != (void *)0x0) {
                free(local_1f8.data);
              }
            }
            else {
              (*(local_1f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        local_1f8.data = local_188.data;
        local_1f8.refcount._0_4_ = local_188.refcount._0_4_;
        local_1f8.refcount._4_4_ = local_188.refcount._4_4_;
        local_1f8.elemsize._0_4_ = (undefined4)local_188.elemsize;
        local_1f8.elemsize._4_4_ = local_188.elemsize._4_4_;
        local_1f8.elempack = local_188.elempack;
        local_1f8.allocator = local_188.allocator;
        local_1f8.dims = local_188.dims;
        local_1f8.w = local_188.w;
        local_1f8.h = local_188.h;
        local_1f8.d = local_188.d;
        local_1f8.c = local_188.c;
        local_1f8.cstep = local_188.cstep;
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_1f8 != &this->CT_data) {
      piVar17 = (this->CT_data).refcount;
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + 1;
        UNLOCK();
      }
      local_1f8.data = (this->CT_data).data;
      piVar17 = (this->CT_data).refcount;
      local_1f8.refcount._0_4_ = SUB84(piVar17,0);
      local_1f8.refcount._4_4_ = (undefined4)((ulong)piVar17 >> 0x20);
      sVar27 = (this->CT_data).elemsize;
      local_1f8.elemsize._0_4_ = (undefined4)sVar27;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar27 >> 0x20);
      local_1f8.elempack = (this->CT_data).elempack;
      local_1f8.allocator = (this->CT_data).allocator;
      uVar5 = (this->CT_data).dims;
      uVar6 = (this->CT_data).w;
      uVar7 = (this->CT_data).h;
      uVar8 = (this->CT_data).d;
      local_1f8.c = (this->CT_data).c;
      local_1f8.cstep = (this->CT_data).cstep;
      p_Var12 = this->_vptr_Gemm_x86[-3];
      local_1f8.dims = uVar5;
      local_1f8.w = uVar6;
      local_1f8.h = uVar7;
      local_1f8.d = uVar8;
    }
    uVar34 = *(uint *)(&this->field_0xf8 + (long)p_Var12);
  }
  p_Var12 = this->_vptr_Gemm_x86[-3];
  uVar22 = 1;
  if (opt->use_packing_layout == true) {
    uVar22 = uVar18;
    if (*(int *)(&this->field_0x108 + (long)p_Var12) == 0) {
      uVar22 = uVar14;
    }
    uVar22 = (uint)((uVar22 & 3) == 0) * 3 + 1;
  }
  if (*(uint *)(&this->field_0x100 + (long)p_Var12) != 0) {
    uVar22 = *(uint *)(&this->field_0x100 + (long)p_Var12);
  }
  local_38 = (ulong)uVar22;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _w = uVar18;
  if (*(int *)(&this->field_0x108 + (long)p_Var12) != 0) {
    _w = uVar14;
    uVar14 = uVar18;
  }
  if (*(int *)(&this->field_0xfc + (long)p_Var12) == 0) {
    Mat::create(this_00,_w,(int)uVar14 / (int)uVar22,(ulong)(uVar22 * 4),uVar22,opt->blob_allocator)
    ;
  }
  else {
    Mat::create(this_00,_w,1,(int)uVar14 / (int)uVar22,(ulong)(uVar22 * 4),uVar22,
                opt->blob_allocator);
  }
  iVar33 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004a7090;
  iVar33 = this->nT;
  iVar35 = iVar33;
  if (iVar33 == 0) {
    iVar35 = opt->num_threads;
  }
  if (opt->num_threads != iVar33 && iVar33 != 0) {
    forward();
  }
  p_Var12 = this->_vptr_Gemm_x86[-3];
  iVar33 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar33 == 0) {
      iVar33 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      iVar36 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      local_1a0 = CONCAT44(local_1a0._4_4_,iVar33);
      if (iVar33 == 0) {
        iVar33 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
        iVar26 = pMVar15->w;
      }
      else {
        iVar33 = pMVar15->w;
        iVar26 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
      }
      if (iVar36 == 0) {
        uVar14 = pMVar15[1].w;
      }
      else {
        uVar14 = pMVar15[1].elempack * (&pMVar15[1].h)[(ulong)(pMVar15[1].dims == 3) * 2];
      }
      local_228 = (Mat *)(ulong)uVar14;
      local_1a8 = CONCAT44(local_1a8._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var12));
      get_optimal_tile_mnk
                (iVar33,uVar14,iVar26,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_K,&TILE_K_1,&TILE_K_2,iVar35);
      local_90 = (ulong)(uint)TILE_K;
      local_a0 = CONCAT44(local_a0._4_4_,(iVar33 + TILE_K + -1) / TILE_K);
      iVar33 = (iVar26 + TILE_K_2 + -1) / TILE_K_2;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_2 * TILE_K,iVar33,iVar35,4,opt->workspace_allocator);
      iVar10 = ((int)local_228 + TILE_K_1 + -1) / TILE_K_1;
      local_138.cstep = 0;
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      local_238 = (ulong)(uint)TILE_K_2;
      local_208 = (ulong)(uint)TILE_K_1;
      Mat::create(&local_138,TILE_K_2 * TILE_K_1,iVar33,iVar10,4,opt->workspace_allocator);
      iVar10 = iVar10 * iVar33;
      if (0 < iVar10) {
        iVar19 = 0;
        do {
          iVar11 = (int)local_208;
          iVar24 = (iVar19 / iVar33) * iVar11;
          iVar23 = (int)local_238;
          iVar21 = (int)((long)iVar19 % (long)iVar33) * iVar23;
          iVar25 = (int)local_228 - iVar24;
          if (iVar11 < iVar25) {
            iVar25 = iVar11;
          }
          iVar11 = iVar26 - iVar21;
          if (iVar23 < iVar26 - iVar21) {
            iVar11 = iVar23;
          }
          pMVar16 = (Mat *)((long)(void **)local_138.data +
                           ((long)iVar19 % (long)iVar33 & 0xffffffffU) * (long)local_138.w *
                           CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize) +
                           (long)(iVar19 / iVar33) * local_138.cstep *
                           CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize));
          if (iVar36 == 0) {
            transpose_pack_B_tile(pMVar15 + 1,pMVar16,iVar24,iVar25,iVar21,iVar11);
          }
          else {
            pack_B_tile(pMVar15 + 1,pMVar16,iVar24,iVar25,iVar21,iVar11);
          }
          iVar19 = iVar19 + 1;
        } while (iVar10 != iVar19);
      }
      uVar20 = local_208;
      local_a8 = 0;
      _TILE_M = (Mat *)0x0;
      uStack_e0 = 0;
      uStack_dc = 0;
      local_d8 = 0;
      uStack_d4 = 0;
      local_d0 = 0;
      local_c8 = (Allocator *)0x0;
      iStack_c0 = 0;
      uStack_bc = 0;
      iStack_b8 = 0;
      uStack_b4._0_4_ = 0;
      uStack_b4._4_4_ = 0;
      if ((((int)local_1a8 != 0) || (uVar34 == 3)) || ((int)local_238 < iVar26)) {
        Mat::create((Mat *)&TILE_M,(int)local_208 * (int)local_90,1,iVar35,4,
                    opt->workspace_allocator);
      }
      if (0 < (int)(uint)local_a0) {
        bVar32 = (int)local_1a8 == 0;
        local_190 = 0;
        pMVar16 = local_228;
        do {
          if ((int)local_1a0 == 0) {
            iVar33 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
            iVar35 = pMVar15->w;
          }
          else {
            iVar33 = pMVar15->w;
            iVar35 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
          }
          iVar26 = (int)local_90;
          iVar10 = iVar26 * (uint)local_190;
          iVar36 = iVar33 - iVar10;
          if (iVar26 < iVar33 - iVar10) {
            iVar36 = iVar26;
          }
          local_48 = 0;
          _TILE_N = (Mat *)0x0;
          uStack_80 = 0;
          uStack_7c = 0;
          local_78 = 0;
          uStack_74 = 0;
          local_70 = 0;
          iStack_58 = 0;
          uStack_54._0_4_ = 0;
          uStack_54._4_4_ = 0;
          local_68 = (Allocator *)0x0;
          iStack_60 = 0;
          uStack_5c = 0;
          if ((((int)local_1a8 != 0) || (uVar34 == 3)) || ((int)local_238 < iVar35)) {
            iVar33 = get_omp_thread_num();
            uVar30 = CONCAT44(uStack_d4,local_d8);
            local_48 = ((long)(int)uStack_bc * (long)iStack_b8 * uVar30 + 0xf & 0xfffffffffffffff0)
                       / uVar30;
            if (iStack_c0 == 4) {
              local_48 = (long)(int)uStack_bc * (long)iStack_b8;
            }
            iStack_60 = iStack_c0 + -1;
            _TILE_N = (Mat *)((long)&_TILE_M->data + (long)iVar33 * uVar30 * local_a8);
            local_78 = local_d8;
            uStack_74 = uStack_d4;
            local_70 = local_d0;
            local_68 = local_c8;
            uStack_5c = uStack_bc;
            iStack_58 = iStack_b8;
            uStack_54._4_4_ = (int)uStack_b4;
            uStack_54._0_4_ = 1;
          }
          uStack_7c = 0;
          uStack_80 = 0;
          local_230 = _TILE_N;
          if (0 < (int)pMVar16) {
            iVar33 = 0;
            do {
              uVar14 = (int)pMVar16 - iVar33;
              local_220 = (ulong)uVar14;
              if ((int)uVar20 < (int)uVar14) {
                local_220 = uVar20 & 0xffffffff;
              }
              local_198 = &local_1f8;
              if (uVar34 == 3) {
                pack_A_tile(&local_1f8,local_230,iVar10,iVar36,iVar33,(int)local_220);
                local_198 = (Mat *)&TILE_N;
              }
              if (0 < iVar35) {
                uVar20 = local_238;
                iVar26 = iVar35;
                iVar19 = 0;
                do {
                  iVar24 = (int)uVar20;
                  iVar25 = iVar26;
                  if (iVar24 < iVar26) {
                    iVar25 = iVar24;
                  }
                  iVar11 = get_omp_thread_num();
                  pvVar4 = local_138.data;
                  pMVar16 = (Mat *)(long)(iVar19 / iVar24);
                  pMVar28 = (Mat *)((long)local_188.data +
                                   (long)local_188.w *
                                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
                                   * (long)pMVar16 +
                                   (long)iVar11 * local_188.cstep *
                                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
                                   );
                  lVar31 = (long)local_138.w;
                  lVar29 = (long)(iVar33 / (int)local_208) * local_138.cstep;
                  uVar30 = CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
                  uVar13 = uVar30;
                  if (iVar33 == 0) {
                    local_218 = uVar30;
                    local_210 = pMVar16;
                    if ((int)local_1a0 == 0) {
                      pack_A_tile(pMVar15,pMVar28,iVar10,iVar36,iVar19,iVar25);
                      uVar13 = local_218;
                      uVar20 = local_238;
                      pMVar16 = local_210;
                    }
                    else {
                      transpose_pack_A_tile(pMVar15,pMVar28,iVar10,iVar36,iVar19,iVar25);
                      uVar13 = local_218;
                      uVar20 = local_238;
                      pMVar16 = local_210;
                    }
                  }
                  iVar24 = iVar19 + (int)uVar20;
                  gemm_transB_packed_tile
                            (pMVar28,(Mat *)((long)(void **)pvVar4 +
                                            lVar31 * uVar13 * (long)pMVar16 + lVar29 * uVar30),
                             local_198,local_230,this_00,uVar34,iVar10,iVar36,iVar33,(int)local_220,
                             iVar19,iVar25,iVar35 <= iVar24 && bVar32);
                  iVar26 = iVar26 - (int)uVar20;
                  iVar19 = iVar24;
                } while (iVar24 < iVar35);
              }
              if ((int)local_1a8 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar10,iVar36,iVar33,(int)local_220);
              }
              iVar33 = iVar33 + (int)local_208;
              uVar20 = local_208;
              pMVar16 = local_228;
            } while (iVar33 < (int)local_228);
          }
          uVar14 = (int)local_190 + 1;
          local_190 = (ulong)uVar14;
        } while (uVar14 != (uint)local_a0);
      }
      piVar17 = (int *)CONCAT44(uStack_dc,uStack_e0);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_c8 == (Allocator *)0x0) {
            if (_TILE_M != (Mat *)0x0) {
              free(_TILE_M);
            }
          }
          else {
            (*local_c8->_vptr_Allocator[3])();
          }
        }
      }
      piVar17 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004a7027;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar33 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      local_228 = (Mat *)CONCAT44(local_228._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var12));
      iVar36 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      local_218 = CONCAT44(local_218._4_4_,iVar33);
      if (iVar33 == 0) {
        iVar33 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
      }
      else {
        iVar33 = pMVar15->w;
      }
      local_1a0 = CONCAT44(local_1a0._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var12));
      get_optimal_tile_mnk
                (iVar33,*(int *)(&this->field_0xf0 + (long)p_Var12),iVar36,
                 *(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar35);
      local_a0 = (ulong)_TILE_N & 0xffffffff;
      local_190 = CONCAT44(local_190._4_4_,(iVar33 + TILE_N + -1) / TILE_N);
      local_238 = (ulong)(uint)TILE_K_1;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_1 * TILE_N,(iVar36 + TILE_K_1 + -1) / TILE_K_1,iVar35,4,
                  opt->workspace_allocator);
      local_138.cstep = 0;
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      if ((((int)local_1a0 != 0) || (uVar34 == 3)) || ((int)local_238 < iVar36)) {
        Mat::create(&local_138,TILE_K * (uint)local_a0,1,iVar35,4,opt->workspace_allocator);
      }
      if (0 < (int)(uint)local_190) {
        local_208 = CONCAT71(local_208._1_7_,(int)local_1a0 == 0);
        local_1a8 = 0;
        uVar20 = local_238;
        iVar33 = (int)local_228;
        do {
          if ((int)local_218 == 0) {
            iVar35 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
            iVar36 = pMVar15->w;
          }
          else {
            iVar35 = pMVar15->w;
            iVar36 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
          }
          iVar10 = (int)local_a0;
          iVar19 = iVar10 * (int)local_1a8;
          iVar26 = iVar35 - iVar19;
          if (iVar10 < iVar35 - iVar19) {
            iVar26 = iVar10;
          }
          local_a8 = 0;
          _TILE_M = (Mat *)0x0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_d8 = 0;
          uStack_d4 = 0;
          local_d0 = 0;
          iStack_b8 = 0;
          uStack_b4._0_4_ = 0;
          uStack_b4._4_4_ = 0;
          local_c8 = (Allocator *)0x0;
          iStack_c0 = 0;
          uStack_bc = 0;
          if ((((int)local_1a0 != 0) || (uVar34 == 3)) || ((int)uVar20 < iVar36)) {
            iVar35 = get_omp_thread_num();
            uVar30 = CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
            local_a8 = ((long)local_138.w * (long)local_138.h * uVar30 + 0xf & 0xfffffffffffffff0) /
                       uVar30;
            if (local_138.dims == 4) {
              local_a8 = (long)local_138.w * (long)local_138.h;
            }
            iStack_c0 = local_138.dims + -1;
            _TILE_M = (Mat *)((long)(void **)local_138.data +
                             (long)iVar35 * uVar30 * local_138.cstep);
            local_d8 = (undefined4)local_138.elemsize;
            uStack_d4 = local_138.elemsize._4_4_;
            local_d0 = local_138.elempack;
            local_c8 = local_138.allocator;
            uStack_bc = local_138.w;
            iStack_b8 = local_138.h;
            uStack_b4._4_4_ = local_138.d;
            uStack_b4._0_4_ = 1;
          }
          uStack_dc = 0;
          uStack_e0 = 0;
          local_230 = _TILE_M;
          if (0 < iVar33) {
            iVar35 = 0;
            do {
              uVar14 = iVar33 - iVar35;
              if (TILE_K < iVar33 - iVar35) {
                uVar14 = TILE_K;
              }
              local_220 = (ulong)uVar14;
              local_198 = &local_1f8;
              if (uVar34 == 3) {
                pack_A_tile(&local_1f8,local_230,iVar19,iVar26,iVar35,uVar14);
                local_198 = (Mat *)&TILE_M;
              }
              if (0 < iVar36) {
                iVar33 = iVar36;
                iVar10 = 0;
                do {
                  iVar24 = (int)uVar20;
                  iVar25 = iVar33;
                  if (iVar24 < iVar33) {
                    iVar25 = iVar24;
                  }
                  iVar11 = get_omp_thread_num();
                  pMVar16 = (Mat *)(long)(iVar10 / iVar24);
                  pMVar28 = (Mat *)((long)local_188.data +
                                   (long)local_188.w *
                                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
                                   * (long)pMVar16 +
                                   (long)iVar11 * local_188.cstep *
                                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
                                   );
                  iVar24 = (this->BT_data).w;
                  sVar27 = (this->BT_data).cstep;
                  sVar2 = (this->BT_data).elemsize;
                  pvVar4 = (this->BT_data).data;
                  if (iVar35 == 0) {
                    local_210 = pMVar16;
                    if ((int)local_218 == 0) {
                      pack_A_tile(pMVar15,pMVar28,iVar19,iVar26,iVar10,iVar25);
                      uVar20 = local_238;
                      pMVar16 = local_210;
                    }
                    else {
                      transpose_pack_A_tile(pMVar15,pMVar28,iVar19,iVar26,iVar10,iVar25);
                      uVar20 = local_238;
                      pMVar16 = local_210;
                    }
                  }
                  iVar11 = iVar10 + (int)uVar20;
                  gemm_transB_packed_tile
                            (pMVar28,(Mat *)((long)pvVar4 +
                                            (long)iVar24 * sVar2 * (long)pMVar16 +
                                            (long)(iVar35 / TILE_K) * sVar27 * sVar2),local_198,
                             local_230,this_00,uVar34,iVar19,iVar26,iVar35,(int)local_220,iVar10,
                             iVar25,(bool)(iVar36 <= iVar11 & (byte)local_208));
                  iVar33 = iVar33 - (int)uVar20;
                  iVar10 = iVar11;
                } while (iVar11 < iVar36);
              }
              if ((int)local_1a0 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar19,iVar26,iVar35,(int)local_220);
              }
              iVar35 = iVar35 + TILE_K;
              iVar33 = (int)local_228;
            } while (iVar35 < (int)local_228);
          }
          uVar14 = (int)local_1a8 + 1;
          local_1a8 = (ulong)uVar14;
        } while (uVar14 != (uint)local_190);
      }
      piVar17 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004a7027;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar14 = *(uint *)(&this->field_0xec + (long)p_Var12);
    local_1a0 = (ulong)uVar14;
    iVar36 = *(int *)(&this->field_0x108 + (long)p_Var12);
    if (iVar33 == 0) {
      pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar33 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      iVar26 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      if (iVar33 == 0) {
        uVar18 = pMVar15->w;
      }
      else {
        uVar18 = pMVar15->elempack * (&pMVar15->h)[(ulong)(pMVar15->dims == 3) * 2];
      }
      get_optimal_tile_mnk
                (uVar14,uVar18,iVar26,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar35);
      local_228 = (Mat *)((ulong)_TILE_N & 0xffffffff);
      uVar14 = (int)(uVar14 + TILE_N + -1) / TILE_N;
      iVar10 = (int)(TILE_K + uVar18 + -1) / TILE_K;
      uVar20 = (ulong)(uint)TILE_K_1;
      iVar19 = (iVar26 + TILE_K_1 + -1) / TILE_K_1;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_1 * TILE_K,iVar19,iVar10,4,opt->workspace_allocator);
      iVar10 = iVar10 * iVar19;
      local_218 = (ulong)uVar18;
      if (0 < iVar10) {
        iVar25 = 0;
        do {
          iVar11 = (iVar25 / iVar19) * TILE_K;
          iVar21 = (int)((long)iVar25 % (long)iVar19) * TILE_K_1;
          iVar24 = (int)local_218 - iVar11;
          if (TILE_K < iVar24) {
            iVar24 = TILE_K;
          }
          iVar23 = iVar26 - iVar21;
          if (TILE_K_1 < iVar26 - iVar21) {
            iVar23 = TILE_K_1;
          }
          pMVar16 = (Mat *)((long)local_188.data +
                           ((long)iVar25 % (long)iVar19 & 0xffffffffU) * (long)local_188.w *
                           CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) +
                           (long)(iVar25 / iVar19) * local_188.cstep *
                           CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
          if (iVar33 == 0) {
            transpose_pack_B_tile(pMVar15,pMVar16,iVar11,iVar24,iVar21,iVar23);
          }
          else {
            pack_B_tile(pMVar15,pMVar16,iVar11,iVar24,iVar21,iVar23);
          }
          iVar25 = iVar25 + 1;
        } while (iVar10 != iVar25);
      }
      local_138.cstep = 0;
      local_1a8 = CONCAT71(local_1a8._1_7_,iVar36 != 0 || (uVar34 == 3 || TILE_K_1 < iVar26));
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      if (iVar36 != 0 || (uVar34 == 3 || TILE_K_1 < iVar26)) {
        Mat::create(&local_138,TILE_K * (int)local_228,1,iVar35,4,opt->workspace_allocator);
      }
      if (0 < (int)uVar14) {
        local_190 = (ulong)uVar14;
        uVar13 = 0;
        local_238 = CONCAT71(local_238._1_7_,iVar36 == 0);
        uVar30 = local_218;
        local_208 = uVar20;
        do {
          iVar35 = (int)local_228;
          iVar10 = iVar35 * (int)uVar13;
          iVar33 = (int)local_1a0 - iVar10;
          if (iVar35 < iVar33) {
            iVar33 = iVar35;
          }
          local_a8 = 0;
          _TILE_M = (Mat *)0x0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_d8 = 0;
          uStack_d4 = 0;
          local_d0 = 0;
          iStack_b8 = 0;
          uStack_b4._0_4_ = 0;
          uStack_b4._4_4_ = 0;
          local_c8 = (Allocator *)0x0;
          iStack_c0 = 0;
          uStack_bc = 0;
          local_220 = uVar13;
          if ((char)local_1a8 != '\0') {
            iVar35 = get_omp_thread_num();
            uVar13 = CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
            local_a8 = ((long)local_138.w * (long)local_138.h * uVar13 + 0xf & 0xfffffffffffffff0) /
                       uVar13;
            if (local_138.dims == 4) {
              local_a8 = (long)local_138.w * (long)local_138.h;
            }
            iStack_c0 = local_138.dims + -1;
            _TILE_M = (Mat *)((long)(void **)local_138.data +
                             (long)iVar35 * uVar13 * local_138.cstep);
            local_d8 = (undefined4)local_138.elemsize;
            uStack_d4 = local_138.elemsize._4_4_;
            local_d0 = local_138.elempack;
            local_c8 = local_138.allocator;
            uStack_bc = local_138.w;
            iStack_b8 = local_138.h;
            uStack_b4._4_4_ = local_138.d;
            uStack_b4._0_4_ = 1;
          }
          uStack_dc = 0;
          uStack_e0 = 0;
          if (0 < (int)uVar30) {
            iVar35 = 0;
            local_210 = _TILE_M;
            do {
              iVar19 = (int)uVar30 - iVar35;
              if (TILE_K < iVar19) {
                iVar19 = TILE_K;
              }
              pMVar15 = &local_1f8;
              if (uVar34 == 3) {
                pack_A_tile(&local_1f8,local_210,iVar10,iVar33,iVar35,iVar19);
                pMVar15 = (Mat *)&TILE_M;
              }
              pMVar16 = local_210;
              bVar9 = (byte)local_238;
              if (0 < iVar26) {
                local_230 = (Mat *)(long)(iVar35 / TILE_K);
                local_198 = pMVar15;
                iVar25 = iVar26;
                iVar24 = 0;
                do {
                  iVar21 = (int)uVar20;
                  iVar11 = iVar25;
                  if (iVar21 < iVar25) {
                    iVar11 = iVar21;
                  }
                  iVar25 = -(iVar21 - iVar25);
                  sVar27 = (this->AT_data).elemsize;
                  iVar23 = iVar24 + iVar21;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar27 * (long)(iVar24 / iVar21) +
                                    (this->AT_data).cstep * local_220 * sVar27),
                             (Mat *)((long)local_188.data +
                                    (long)local_188.w *
                                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize
                                            ) * (long)(iVar24 / iVar21) +
                                    local_188.cstep * (long)local_230 *
                                    CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize
                                            )),local_198,pMVar16,this_00,uVar34,iVar10,iVar33,iVar35
                             ,iVar19,iVar24,iVar11,(bool)(iVar26 <= iVar23 & bVar9));
                  uVar20 = local_208;
                  iVar24 = iVar23;
                } while (iVar23 < iVar26);
              }
              if (iVar36 != 0) {
                transpose_unpack_output_tile(local_210,this_00,iVar10,iVar33,iVar35,iVar19);
              }
              iVar35 = iVar35 + TILE_K;
              uVar30 = local_218;
            } while (iVar35 < (int)local_218);
          }
          uVar13 = local_220 + 1;
        } while (uVar13 != local_190);
      }
      piVar17 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004a7027;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar33 = *(int *)(&this->field_0xf0 + (long)p_Var12);
      iVar26 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      get_optimal_tile_mnk
                (uVar14,iVar33,iVar26,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_M,&TILE_N,&TILE_K,iVar35);
      local_218 = (ulong)_TILE_M & 0xffffffff;
      uVar20 = (long)(int)(uVar14 + TILE_M + -1) / (long)TILE_M;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      local_238 = CONCAT71(local_238._1_7_,iVar36 != 0 || (uVar34 == 3 || TILE_K < iVar26));
      if (iVar36 != 0 || (uVar34 == 3 || TILE_K < iVar26)) {
        Mat::create(&local_188,TILE_N * TILE_M,1,iVar35,4,opt->workspace_allocator);
      }
      if (0 < (int)uVar20) {
        local_198 = (Mat *)CONCAT71(local_198._1_7_,iVar36 == 0);
        pMVar15 = (Mat *)0x0;
        local_208 = CONCAT44(local_208._4_4_,TILE_N);
        local_228 = (Mat *)(uVar20 & 0xffffffff);
        do {
          iVar10 = (int)local_218;
          iVar19 = iVar10 * (int)pMVar15;
          iVar35 = (int)local_1a0 - iVar19;
          if (iVar10 < iVar35) {
            iVar35 = iVar10;
          }
          local_138.cstep = 0;
          local_138.data = (Mat *)0x0;
          local_138.refcount._0_4_ = 0;
          local_138.refcount._4_4_ = 0;
          local_138.elemsize._0_4_ = 0;
          local_138.elemsize._4_4_ = 0;
          local_138.elempack = 0;
          local_138.h = 0;
          local_138.d = 0;
          local_138.c = 0;
          local_138.allocator = (Allocator *)0x0;
          local_138.dims = 0;
          local_138.w = 0;
          local_210 = pMVar15;
          if ((byte)local_238 != '\0') {
            iVar10 = get_omp_thread_num();
            uVar20 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
            local_138.cstep =
                 ((long)local_188.w * (long)local_188.h * uVar20 + 0xf & 0xfffffffffffffff0) /
                 uVar20;
            if (local_188.dims == 4) {
              local_138.cstep = (long)local_188.w * (long)local_188.h;
            }
            local_138.dims = local_188.dims + -1;
            local_138.data =
                 (void *)((long)iVar10 * uVar20 * local_188.cstep + (long)local_188.data);
            local_138.elemsize._0_4_ = (undefined4)local_188.elemsize;
            local_138.elemsize._4_4_ = local_188.elemsize._4_4_;
            local_138.elempack = local_188.elempack;
            local_138.allocator = local_188.allocator;
            local_138.w = local_188.w;
            local_138.h = local_188.h;
            local_138.c = local_188.d;
            local_138.d = 1;
          }
          local_138.refcount._4_4_ = 0;
          local_138.refcount._0_4_ = 0;
          if (0 < iVar33) {
            iVar10 = 0;
            local_230 = (Mat *)local_138.data;
            do {
              iVar25 = iVar33 - iVar10;
              if ((int)local_208 < iVar33 - iVar10) {
                iVar25 = (int)local_208;
              }
              pMVar15 = &local_1f8;
              if (uVar34 == 3) {
                pack_A_tile(&local_1f8,local_230,iVar19,iVar35,iVar10,iVar25);
                pMVar15 = &local_138;
              }
              pMVar28 = local_210;
              pMVar16 = local_230;
              if (0 < iVar26) {
                local_220 = (ulong)(iVar10 / (int)local_208);
                iVar24 = iVar26;
                iVar11 = 0;
                do {
                  iVar21 = iVar24;
                  if (TILE_K < iVar24) {
                    iVar21 = TILE_K;
                  }
                  iVar24 = -(TILE_K - iVar24);
                  sVar27 = (this->AT_data).elemsize;
                  sVar2 = (this->BT_data).elemsize;
                  iVar23 = iVar11 + TILE_K;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar27 * (long)(iVar11 / TILE_K) +
                                    (this->AT_data).cstep * (long)pMVar28 * sVar27),
                             (Mat *)((long)(this->BT_data).data +
                                    (long)(this->BT_data).w * sVar2 * (long)(iVar11 / TILE_K) +
                                    (this->BT_data).cstep * local_220 * sVar2),pMVar15,pMVar16,
                             this_00,uVar34,iVar19,iVar35,iVar10,iVar25,iVar11,iVar21,
                             (bool)(iVar26 <= iVar23 & (byte)local_198));
                  iVar11 = iVar23;
                } while (iVar23 < iVar26);
              }
              if (iVar36 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar19,iVar35,iVar10,iVar25);
              }
              iVar10 = iVar10 + (int)local_208;
            } while (iVar10 < iVar33);
          }
          pMVar15 = (Mat *)((long)&local_210->data + 1);
        } while (pMVar15 != local_228);
      }
      piVar17 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
joined_r0x004a7027:
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  pp_Var3 = this->_vptr_Gemm_x86;
  iVar33 = 0;
  if ((*(float *)((long)&(this->CT_data).h + (long)pp_Var3[-3]) != 1.0) &&
     (uVar14 = (int)local_38 * (int)this_00->cstep * this_00->c, iVar33 = 0, 0 < (int)uVar14)) {
    pvVar4 = this_00->data;
    iVar33 = 0;
    uVar20 = 0;
    do {
      *(float *)((long)pvVar4 + uVar20 * 4) =
           *(float *)((long)pvVar4 + uVar20 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var3[-3]);
      uVar20 = uVar20 + 1;
    } while (uVar14 != uVar20);
  }
LAB_004a7090:
  piVar17 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int Gemm_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}